

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O3

double algdiv(double *a,double *b)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double local_18;
  
  dVar4 = *a;
  dVar1 = *b;
  if (dVar4 <= dVar1) {
    dVar3 = dVar4 / dVar1 + 1.0;
    dVar2 = (dVar4 / dVar1) / dVar3;
    dVar3 = 1.0 / dVar3;
    local_18 = dVar4 + -0.5 + dVar1;
  }
  else {
    dVar3 = dVar1 / dVar4 + 1.0;
    dVar2 = 1.0 / dVar3;
    dVar3 = (dVar1 / dVar4) / dVar3;
    local_18 = dVar1 + -0.5 + dVar4;
  }
  algdiv::T1 = dVar4 / dVar1;
  dVar4 = dVar3 * dVar3;
  dVar5 = dVar3 + dVar4 + 1.0;
  dVar7 = dVar4 * dVar5 + dVar3 + 1.0;
  dVar8 = dVar4 * dVar7 + dVar3 + 1.0;
  dVar9 = dVar4 * dVar8 + dVar3 + 1.0;
  dVar6 = (1.0 / dVar1) * (1.0 / dVar1);
  algdiv::w = (dVar2 / dVar1) *
              ((((((dVar4 * dVar9 + dVar3 + 1.0) * -0.00165322962780713 * dVar6 +
                  dVar9 * 0.000837308034031215) * dVar6 + dVar8 * -0.00059520293135187) * dVar6 +
                dVar7 * 0.00079365066682539) * dVar6 + dVar5 * -0.00277777777760991) * dVar6 +
              0.0833333333333333);
  dVar4 = alnrel(&algdiv::T1);
  algdiv::u = dVar4 * local_18;
  dVar4 = *a;
  dVar1 = log(*b);
  dVar4 = (dVar1 + -1.0) * dVar4;
  dVar1 = algdiv::u;
  if (algdiv::u <= dVar4) {
    dVar1 = dVar4;
  }
  return (algdiv::w -
         (double)(~-(ulong)(dVar4 < algdiv::u) & (ulong)algdiv::u |
                 -(ulong)(dVar4 < algdiv::u) & (ulong)dVar4)) - dVar1;
}

Assistant:

double algdiv(double *a,double *b)
/*
-----------------------------------------------------------------------

     COMPUTATION OF LN(GAMMA(B)/GAMMA(A+B)) WHEN B .GE. 8

                         --------

     IN THIS ALGORITHM, DEL(X) IS THE FUNCTION DEFINED BY
     LN(GAMMA(X)) = (X - 0.5)*LN(X) - X + 0.5*LN(2*PI) + DEL(X).

-----------------------------------------------------------------------
*/
{
static double c0 = .833333333333333e-01;
static double c1 = -.277777777760991e-02;
static double c2 = .793650666825390e-03;
static double c3 = -.595202931351870e-03;
static double c4 = .837308034031215e-03;
static double c5 = -.165322962780713e-02;
static double algdiv,c,d,h,s11,s3,s5,s7,s9,t,u,v,w,x,x2,T1;
/*
     ..
     .. Executable Statements ..
*/
    if(*a <= *b) goto S10;
    h = *b/ *a;
    c = 1.0e0/(1.0e0+h);
    x = h/(1.0e0+h);
    d = *a+(*b-0.5e0);
    goto S20;
S10:
    h = *a/ *b;
    c = h/(1.0e0+h);
    x = 1.0e0/(1.0e0+h);
    d = *b+(*a-0.5e0);
S20:
/*
                SET SN = (1 - X**N)/(1 - X)
*/
    x2 = x*x;
    s3 = 1.0e0+(x+x2);
    s5 = 1.0e0+(x+x2*s3);
    s7 = 1.0e0+(x+x2*s5);
    s9 = 1.0e0+(x+x2*s7);
    s11 = 1.0e0+(x+x2*s9);
/*
                SET W = DEL(B) - DEL(A + B)
*/
    t = pow(1.0e0/ *b,2.0);
    w = ((((c5*s11*t+c4*s9)*t+c3*s7)*t+c2*s5)*t+c1*s3)*t+c0;
    w *= (c/ *b);
/*
                    COMBINE THE RESULTS
*/
    T1 = *a/ *b;
    u = d*alnrel(&T1);
    v = *a*(log(*b)-1.0e0);
    if(u <= v) goto S30;
    algdiv = w-v-u;
    return algdiv;
S30:
    algdiv = w-u-v;
    return algdiv;
}